

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O1

void __thiscall
btMultiBodyPoint2Point::btMultiBodyPoint2Point
          (btMultiBodyPoint2Point *this,btMultiBody *bodyA,int linkA,btMultiBody *bodyB,int linkB,
          btVector3 *pivotInA,btVector3 *pivotInB)

{
  int iVar1;
  float *pfVar2;
  undefined8 uVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  btMultiBodyConstraint::btMultiBodyConstraint
            (&this->super_btMultiBodyConstraint,bodyA,bodyB,linkA,linkB,3,false);
  (this->super_btMultiBodyConstraint)._vptr_btMultiBodyConstraint =
       (_func_int **)&PTR__btMultiBodyPoint2Point_002290c8;
  this->m_rigidBodyA = (btRigidBody *)0x0;
  this->m_rigidBodyB = (btRigidBody *)0x0;
  uVar3 = *(undefined8 *)(pivotInA->m_floats + 2);
  *(undefined8 *)(this->m_pivotInA).m_floats = *(undefined8 *)pivotInA->m_floats;
  *(undefined8 *)((this->m_pivotInA).m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)(pivotInB->m_floats + 2);
  *(undefined8 *)(this->m_pivotInB).m_floats = *(undefined8 *)pivotInB->m_floats;
  *(undefined8 *)((this->m_pivotInB).m_floats + 2) = uVar3;
  iVar1 = (this->super_btMultiBodyConstraint).m_data.m_size;
  lVar7 = (long)iVar1;
  if ((lVar7 < 4) && (iVar1 != 3)) {
    if ((this->super_btMultiBodyConstraint).m_data.m_capacity < 3) {
      pfVar4 = (float *)btAlignedAllocInternal(0xc,0x10);
      lVar5 = (long)(this->super_btMultiBodyConstraint).m_data.m_size;
      if (0 < lVar5) {
        pfVar2 = (this->super_btMultiBodyConstraint).m_data.m_data;
        lVar6 = 0;
        do {
          pfVar4[lVar6] = pfVar2[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
      }
      pfVar2 = (this->super_btMultiBodyConstraint).m_data.m_data;
      if (pfVar2 != (float *)0x0) {
        if ((this->super_btMultiBodyConstraint).m_data.m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar2);
        }
        (this->super_btMultiBodyConstraint).m_data.m_data = (float *)0x0;
      }
      (this->super_btMultiBodyConstraint).m_data.m_ownsMemory = true;
      (this->super_btMultiBodyConstraint).m_data.m_data = pfVar4;
      (this->super_btMultiBodyConstraint).m_data.m_capacity = 3;
    }
    if (iVar1 != 3) {
      memset((this->super_btMultiBodyConstraint).m_data.m_data + lVar7,0,lVar7 * -4 + 0xc);
    }
  }
  (this->super_btMultiBodyConstraint).m_data.m_size = 3;
  return;
}

Assistant:

btMultiBodyPoint2Point::btMultiBodyPoint2Point(btMultiBody* bodyA, int linkA, btMultiBody* bodyB, int linkB, const btVector3& pivotInA, const btVector3& pivotInB)
	:btMultiBodyConstraint(bodyA,bodyB,linkA,linkB,BTMBP2PCONSTRAINT_DIM,false),
	m_rigidBodyA(0),
	m_rigidBodyB(0),
	m_pivotInA(pivotInA),
	m_pivotInB(pivotInB)
{
    m_data.resize(BTMBP2PCONSTRAINT_DIM);//at least store the applied impulses
}